

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeDriverGetExtensionFunctionAddress
          (ze_driver_handle_t hDriver,char *name,void **ppFunctionAddress)

{
  _func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_driver_handle_t_ptr_char_ptr_void_ptr_ptr *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  ulong *puVar5;
  void **in_RDX;
  long lVar6;
  char *in_RSI;
  _ze_driver_handle_t *in_RDI;
  ulong uVar7;
  APITracerCallbackDataImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_driver_get_extension_function_address_params_t tracerParams;
  void **local_f0;
  char *local_e8;
  _ze_driver_handle_t *local_e0;
  _func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *local_d8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_d0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_b8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_98;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_80;
  APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_68;
  APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_58;
  _ze_driver_get_extension_function_address_params_t local_48;
  
  if (DAT_0017f1f0 == (_func__ze_result_t__ze_driver_handle_t_ptr_char_ptr_void_ptr_ptr *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_f0 = in_RDX;
    local_e8 = in_RSI;
    local_e0 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar4 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_0017f1f0)(local_e0,local_e8,local_f0);
      return _Var2;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar4 = '\x01';
    local_48.phDriver = &local_e0;
    local_48.pname = &local_e8;
    local_48.pppFunctionAddress = &local_f0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_d8 = (_func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    puVar5 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar5 != (ulong *)0x0) && (*puVar5 != 0)) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_58.current_api_callback =
             *(_func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)(puVar5[1] + 0xc0 + lVar6);
        p_Var1 = *(_func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)(puVar5[1] + 0x718 + lVar6);
        local_58.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        if (vStack_d0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            vStack_d0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>
                      *)&vStack_d0,
                     (iterator)
                     vStack_d0.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_58);
        }
        else {
          (vStack_d0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               local_58.current_api_callback;
          (vStack_d0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_58.pUserData;
          vStack_d0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_d0.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_68.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        local_68.current_api_callback = p_Var1;
        if (local_b8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_b8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>
                      *)&local_b8,
                     (iterator)
                     local_b8.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        }
        else {
          (local_b8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
          (local_b8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_68.pUserData;
          local_b8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_b8.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0xcb8;
      } while (uVar7 < *puVar5);
    }
    p_Var1 = local_d8;
    zeApiPtr = DAT_0017f1f0;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_80,&vStack_d0);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_98,&local_b8);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_driver_handle_t*,char_const*,void**),_ze_driver_get_extension_function_address_params_t*,void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>,_ze_driver_handle_t*&,char_const*&,void**&>
                      (zeApiPtr,&local_48,p_Var1,&local_80,&local_98,local_48.phDriver,
                       local_48.pname,local_48.pppFunctionAddress);
    if (local_98.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_d0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_d0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_d0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_d0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetExtensionFunctionAddress(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        const char* name,                               ///< [in] extension function name
        void** ppFunctionAddress                        ///< [out] pointer to function pointer
        )
    {
        auto pfnGetExtensionFunctionAddress = context.zeDdiTable.Driver.pfnGetExtensionFunctionAddress;

        if( nullptr == pfnGetExtensionFunctionAddress)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Driver.pfnGetExtensionFunctionAddress, hDriver, name, ppFunctionAddress);

        // capture parameters
        ze_driver_get_extension_function_address_params_t tracerParams = {
            &hDriver,
            &name,
            &ppFunctionAddress
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnDriverGetExtensionFunctionAddressCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnDriverGetExtensionFunctionAddressCb_t, Driver, pfnGetExtensionFunctionAddressCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Driver.pfnGetExtensionFunctionAddress,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phDriver,
                                                  *tracerParams.pname,
                                                  *tracerParams.pppFunctionAddress);
    }